

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMonitor.cpp
# Opt level: O1

uint __thiscall MemoryMonitor::getTotalMemory(MemoryMonitor *this)

{
  int iVar1;
  ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::PtrHasher> *this_00;
  undefined4 extraout_var;
  uint uVar2;
  
  this_00 = (ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::PtrHasher> *)operator_new(0x28);
  uVar2 = 0;
  ValueHashTableOfEnumerator<unsigned_int,_xercesc_4_0::PtrHasher>::ValueHashTableOfEnumerator
            (this_00,this->fHashTable,false);
  iVar1 = (*(this_00->super_XMLEnumerator<unsigned_int>)._vptr_XMLEnumerator[2])(this_00);
  if ((char)iVar1 != '\0') {
    uVar2 = 0;
    do {
      iVar1 = (*(this_00->super_XMLEnumerator<unsigned_int>)._vptr_XMLEnumerator[3])(this_00);
      uVar2 = uVar2 + *(int *)CONCAT44(extraout_var,iVar1);
      iVar1 = (*(this_00->super_XMLEnumerator<unsigned_int>)._vptr_XMLEnumerator[2])(this_00);
    } while ((char)iVar1 != '\0');
  }
  (*(this_00->super_XMLEnumerator<unsigned_int>)._vptr_XMLEnumerator[1])(this_00);
  return uVar2;
}

Assistant:

unsigned int MemoryMonitor::getTotalMemory()
{
    unsigned int total = 0;
    ValueHashTableOfEnumerator<unsigned int> *memEnum =
            new ValueHashTableOfEnumerator<unsigned int>(fHashTable);
    while(memEnum->hasMoreElements()) {
        total += memEnum->nextElement();
    }
    delete memEnum;
    return total;
}